

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O3

void ngram_fwdflat_finish(ngram_search_t *ngs)

{
  double dVar1;
  uint uVar2;
  chan_t *elem;
  chan_s *pcVar3;
  ps_latnode_s *ppVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  ps_latnode_t *elem_00;
  long lVar9;
  
  puVar7 = (uint *)ngs->fwdflat_wordlist;
  uVar8 = *puVar7;
  if (-1 < (int)uVar8) {
    lVar9 = 4;
    do {
      if (((ngs->base).dict)->word[uVar8].pronlen != 1) {
        elem = ngs->word_chan[uVar8];
        if (elem == (chan_t *)0x0) {
          __assert_fail("ngs->word_chan[wid] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                        ,0x38e,"void destroy_fwdflat_chan(ngram_search_t *)");
        }
        pcVar3 = elem->next;
        __listelem_free__(ngs->root_chan_alloc,elem,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x397);
        ngs->word_chan[uVar8] = pcVar3;
        ngram_search_free_all_rc(ngs,uVar8);
        puVar7 = (uint *)ngs->fwdflat_wordlist;
      }
      uVar8 = *(uint *)((long)puVar7 + lVar9);
      lVar9 = lVar9 + 4;
    } while (-1 < (int)uVar8);
  }
  if (ngs->fwdtree != '\0') {
    iVar5 = ngs->n_frame;
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        elem_00 = ngs->frm_wordlist[lVar9];
        if (ngs->frm_wordlist[lVar9] != (ps_latnode_t *)0x0) {
          do {
            ppVar4 = elem_00->next;
            __listelem_free__(ngs->latnode_alloc,elem_00,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                              ,0x37b);
            elem_00 = ppVar4;
          } while (ppVar4 != (ps_latnode_s *)0x0);
          iVar5 = ngs->n_frame;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar5);
    }
  }
  iVar6 = (ngs->base).n_words;
  iVar5 = iVar6 + 0x1f;
  iVar6 = iVar6 + 0x3e;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  memset(ngs->word_active,0,(long)(iVar6 >> 5) << 2);
  uVar8 = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,uVar8);
  ptmr_stop(&ngs->fwdflat_perf);
  if (0 < (int)uVar8) {
    iVar5 = uVar8 + 1;
    lVar9 = ps_config_int((ngs->base).config,"frate");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b1,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
            (long)(int)(ngs->bpidx + (uVar8 >> 1)) / (long)iVar5 & 0xffffffff);
    uVar2 = (ngs->st).n_senone_active_utt;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b3,"%8d senones evaluated (%d/fr)\n",(ulong)uVar2,
            (long)(int)((uVar8 >> 1) + uVar2) / (long)iVar5 & 0xffffffff);
    uVar8 = (ngs->st).n_fwdflat_chan;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b5,"%8d channels searched (%d/fr)\n",(ulong)uVar8,
            (long)(int)uVar8 / (long)iVar5 & 0xffffffff);
    uVar8 = (ngs->st).n_fwdflat_words;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3b7,"%8d words searched (%d/fr)\n",(ulong)uVar8,
            (long)(int)uVar8 / (long)iVar5 & 0xffffffff);
    uVar8 = (ngs->st).n_fwdflat_word_transition;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3ba,"%8d word transitions (%d/fr)\n",(ulong)uVar8,
            (long)(int)uVar8 / (long)iVar5 & 0xffffffff);
    dVar1 = (double)(ngs->fwdflat_perf).t_cpu;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3bd,"fwdflat %.2f CPU %.3f xRT\n",dVar1,dVar1 / ((double)iVar5 / (double)lVar9));
    dVar1 = (double)(ngs->fwdflat_perf).t_elapsed;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
            ,0x3c0,"fwdflat %.2f wall %.3f xRT\n",dVar1,dVar1 / ((double)iVar5 / (double)lVar9));
    return;
  }
  return;
}

Assistant:

void
ngram_fwdflat_finish(ngram_search_t *ngs)
{
    int32 cf;

    destroy_fwdflat_chan(ngs);
    destroy_fwdflat_wordlist(ngs);
    bitvec_clear_all(ngs->word_active, ps_search_n_words(ngs));

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    ptmr_stop(&ngs->fwdflat_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr)\n",
               ngs->st.n_fwdflat_chan, ngs->st.n_fwdflat_chan / (cf + 1));
        E_INFO("%8d words searched (%d/fr)\n",
               ngs->st.n_fwdflat_words, ngs->st.n_fwdflat_words / (cf + 1));
        E_INFO("%8d word transitions (%d/fr)\n",
               ngs->st.n_fwdflat_word_transition,
               ngs->st.n_fwdflat_word_transition / (cf + 1));
        E_INFO("fwdflat %.2f CPU %.3f xRT\n",
               ngs->fwdflat_perf.t_cpu,
               ngs->fwdflat_perf.t_cpu / n_speech);
        E_INFO("fwdflat %.2f wall %.3f xRT\n",
               ngs->fwdflat_perf.t_elapsed,
               ngs->fwdflat_perf.t_elapsed / n_speech);
    }
}